

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O2

void parse_arguments(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  OptionParser *parser;
  char *pcVar4;
  OptionResult result;
  
  parser = option_parser_new(parse_arguments::options,9,argc,argv);
  bVar2 = false;
  while (!bVar2) {
    pcVar4 = (char *)parser;
    option_parser_next(&result,parser);
    bVar2 = false;
    switch(result.kind) {
    case OPTION_RESULT_KIND_UNKNOWN:
      pcVar4 = "ERROR: Unknown option: %s.\n\n";
LAB_001119a2:
      fprintf(_stderr,pcVar4,result.field_2.value);
LAB_001119d0:
      usage((int)argv,(char **)pcVar4);
      option_parser_delete(parser);
      exit(1);
    case OPTION_RESULT_KIND_EXPECTED_VALUE:
      result.field_2 = (anon_union_8_2_3250017c_for_OptionResult_2)(result.option)->long_name;
      pcVar4 = "ERROR: Option --%s requires a value.\n\n";
      goto LAB_001119a2;
    case OPTION_RESULT_KIND_BAD_SHORT_OPTION:
      pcVar4 = "ERROR: Short option -%c is too long: %s.\n\n";
      fprintf(_stderr,"ERROR: Short option -%c is too long: %s.\n\n",
              (ulong)(uint)(int)(result.option)->short_name,result.field_2.value);
      goto LAB_001119d0;
    case OPTION_RESULT_KIND_OPTION:
      cVar1 = (result.option)->short_name;
      if (cVar1 == 'C') {
        s_cgb_color_curve = atoi(result.field_2.value);
      }
      else if (cVar1 == 'J') {
        s_write_joypad_filename = result.field_2.value;
      }
      else if (cVar1 == 'P') {
        s_builtin_palette = atoi(result.field_2.value);
      }
      else if (cVar1 == 'j') {
        s_read_joypad_filename = result.field_2.value;
      }
      else if (cVar1 == 's') {
        s_random_seed = atoi(result.field_2.value);
      }
      else if (cVar1 == 'x') {
        s_render_scale = atoi(result.field_2.value);
      }
      else {
        if (cVar1 == 'h') goto LAB_001119d0;
        pcVar4 = (result.option)->long_name;
        iVar3 = strcmp(pcVar4,"force-dmg");
        if (iVar3 == 0) {
          s_force_dmg = TRUE;
        }
        else {
          iVar3 = strcmp(pcVar4,"sgb-border");
          if (iVar3 != 0) {
            abort();
          }
          s_use_sgb_border = TRUE;
        }
      }
      break;
    case OPTION_RESULT_KIND_ARG:
      s_rom_filename = result.field_2.value;
      break;
    case OPTION_RESULT_KIND_DONE:
      bVar2 = true;
    }
  }
  if (s_rom_filename != (char *)0x0) {
    option_parser_delete(parser);
    return;
  }
  pcVar4 = (char *)0x1b;
  fwrite("ERROR: expected input .gb\n\n",0x1b,1,_stderr);
  goto LAB_001119d0;
}

Assistant:

void parse_arguments(int argc, char** argv) {
  static const Option options[] = {
    {'h', "help", 0},
    {'j', "read-joypad", 1},
    {'J', "write-joypad", 1},
    {'s', "seed", 1},
    {'P', "palette", 1},
    {'x', "scale", 1},
    {'C', "cgb-color", 1},
    {0, "force-dmg", 0},
    {0, "sgb-border", 0},
  };

  struct OptionParser* parser = option_parser_new(
      options, sizeof(options) / sizeof(options[0]), argc, argv);

  int errors = 0;
  int done = 0;
  while (!done) {
    OptionResult result = option_parser_next(parser);
    switch (result.kind) {
      case OPTION_RESULT_KIND_UNKNOWN:
        PRINT_ERROR("ERROR: Unknown option: %s.\n\n", result.arg);
        goto error;

      case OPTION_RESULT_KIND_EXPECTED_VALUE:
        PRINT_ERROR("ERROR: Option --%s requires a value.\n\n",
                    result.option->long_name);
        goto error;

      case OPTION_RESULT_KIND_BAD_SHORT_OPTION:
        PRINT_ERROR("ERROR: Short option -%c is too long: %s.\n\n",
                    result.option->short_name, result.arg);
        goto error;

      case OPTION_RESULT_KIND_OPTION:
        switch (result.option->short_name) {
          case 'h':
            goto error;

          case 'j':
            s_read_joypad_filename = result.value;
            break;

          case 'J':
            s_write_joypad_filename = result.value;
            break;

          case 's':
            s_random_seed = atoi(result.value);
            break;

          case 'P':
            s_builtin_palette = atoi(result.value);
            break;

          case 'x':
            s_render_scale = atoi(result.value);
            break;

          case 'C':
            s_cgb_color_curve = atoi(result.value);
            break;

          default:
            if (strcmp(result.option->long_name, "force-dmg") == 0) {
              s_force_dmg = TRUE;
            } else if (strcmp(result.option->long_name, "sgb-border") == 0) {
              s_use_sgb_border = TRUE;
            } else {
              abort();
            }
            break;
        }
        break;

      case OPTION_RESULT_KIND_ARG:
        s_rom_filename = result.value;
        break;

      case OPTION_RESULT_KIND_DONE:
        done = 1;
        break;
    }
  }

  if (!s_rom_filename) {
    PRINT_ERROR("ERROR: expected input .gb\n\n");
    goto error;
  }

  option_parser_delete(parser);
  return;

error:
  usage(argc, argv);
  option_parser_delete(parser);
  exit(1);
}